

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O2

Token __thiscall slang::syntax::SyntaxNode::getFirstToken(SyntaxNode *this)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  size_t index;
  Token TVar3;
  ConstTokenOrSyntax child;
  Token local_48;
  ConstTokenOrSyntax local_38;
  
  sVar1 = getChildCount(this);
  index = 0;
  do {
    if (sVar1 == index) {
      parsing::Token::Token(&local_48);
      return local_48;
    }
    getChild(&local_38,this,index);
    if (local_38.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        _M_index == '\0') {
      TVar3 = ConstTokenOrSyntax::token(&local_38);
      if (TVar3.info != (Info *)0x0) {
        TVar3 = ConstTokenOrSyntax::token(&local_38);
        return TVar3;
      }
    }
    else {
      pSVar2 = ConstTokenOrSyntax::node(&local_38);
      if (pSVar2 != (SyntaxNode *)0x0) {
        pSVar2 = ConstTokenOrSyntax::node(&local_38);
        local_48 = getFirstToken(pSVar2);
        if (local_48.info != (Info *)0x0) {
          return local_48;
        }
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

parsing::Token SyntaxNode::getFirstToken() const {
    size_t childCount = getChildCount();
    for (size_t i = 0; i < childCount; i++) {
        auto child = getChild(i);
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getFirstToken();
            if (result)
                return result;
        }
    }
    return Token();
}